

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,int rounding_corners_flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ImU32 IVar3;
  ImU32 IVar4;
  uint uVar5;
  byte bVar6;
  undefined1 in_register_00001208 [56];
  undefined1 in_register_00001248 [56];
  undefined8 in_XMM3_Qb;
  float fVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  ImVec2 local_90;
  ImVec2 local_88;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  auVar9._8_56_ = in_register_00001248;
  auVar9._0_8_ = p_max;
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = p_min;
  local_90 = (ImVec2)vmovlps_avx(auVar8._0_16_);
  local_88 = (ImVec2)vmovlps_avx(auVar9._0_16_);
  if (col < 0xff000000) {
    local_58 = grid_off.x;
    fStack_54 = grid_off.y;
    local_7c = grid_step;
    local_78 = rounding;
    uStack_50 = in_XMM3_Qb;
    IVar3 = ImAlphaBlendColors(0xffcccccc,col);
    IVar3 = GetColorU32(IVar3);
    IVar4 = ImAlphaBlendColors(0xff808080,col);
    IVar4 = GetColorU32(IVar4);
    ImDrawList::AddRectFilled(draw_list,&local_90,&local_88,IVar3,local_78,rounding_corners_flags);
    auVar2._4_4_ = fStack_54;
    auVar2._0_4_ = local_58;
    auVar2._8_8_ = uStack_50;
    auVar2 = vmovshdup_avx(auVar2);
    local_74 = auVar2._0_4_ + local_90.y;
    bVar6 = 0;
    fVar7 = local_7c;
    while (local_74 < local_88.y) {
      auVar1 = vminss_avx(ZEXT416((uint)local_88.y),ZEXT416((uint)local_74));
      auVar2 = vcmpss_avx(ZEXT416((uint)local_74),ZEXT416((uint)local_90.y),1);
      local_48 = vblendvps_avx(auVar1,ZEXT416((uint)local_90.y),auVar2);
      auVar9 = ZEXT1664(local_48);
      local_74 = local_74 + fVar7;
      auVar2 = vminss_avx(ZEXT416((uint)local_74),ZEXT416((uint)local_88.y));
      auVar8 = ZEXT1664(auVar2);
      local_70 = auVar2._0_4_;
      if (local_48._0_4_ < local_70) {
        for (local_6c = (float)bVar6 * fVar7 + local_58 + local_90.x; local_6c < local_88.x;
            local_6c = fVar7 + fVar7 + local_6c) {
          auVar1 = vminss_avx(ZEXT416((uint)local_88.x),ZEXT416((uint)local_6c));
          auVar2 = vcmpss_avx(ZEXT416((uint)local_6c),ZEXT416((uint)local_90.x),1);
          auVar2 = vblendvps_avx(auVar1,ZEXT416((uint)local_90.x),auVar2);
          auVar1 = vminss_avx(ZEXT416((uint)(local_6c + fVar7)),ZEXT416((uint)local_88.x));
          local_60.x = auVar2._0_4_;
          local_68.x = auVar1._0_4_;
          if (local_60.x < local_68.x) {
            uVar5 = 0;
            local_60.y = auVar9._0_4_;
            if (local_60.y <= local_90.y) {
              uVar5 = (uint)(local_60.x <= local_90.x);
              if (local_88.x <= local_68.x) {
                uVar5 = local_60.x <= local_90.x | 2;
              }
            }
            local_68.y = auVar8._0_4_;
            if (local_88.y <= local_68.y) {
              if (local_60.x <= local_90.x) {
                uVar5 = uVar5 + 4;
              }
              if (local_88.x <= local_68.x) {
                uVar5 = uVar5 | 8;
              }
            }
            fVar7 = 0.0;
            if ((uVar5 & rounding_corners_flags) != 0) {
              fVar7 = local_78;
            }
            ImDrawList::AddRectFilled
                      (draw_list,&local_60,&local_68,IVar4,fVar7,uVar5 & rounding_corners_flags);
            auVar9 = ZEXT1664(local_48);
            auVar8 = ZEXT464((uint)local_70);
            fVar7 = local_7c;
          }
        }
      }
      bVar6 = bVar6 ^ 1;
    }
  }
  else {
    ImDrawList::AddRectFilled(draw_list,&local_90,&local_88,col,rounding,rounding_corners_flags);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, int rounding_corners_flags)
{
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, rounding_corners_flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                int rounding_corners_flags_cell = 0;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotRight; }
                rounding_corners_flags_cell &= rounding_corners_flags;
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding_corners_flags_cell ? rounding : 0.0f, rounding_corners_flags_cell);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, rounding_corners_flags);
    }
}